

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# labeling_grana_2010.h
# Opt level: O2

void __thiscall BBDT<TTA>::PerformLabeling(BBDT<TTA> *this)

{
  undefined8 uVar1;
  char cVar2;
  Mat1b *pMVar3;
  Mat1i *pMVar4;
  uint *puVar5;
  uint *puVar6;
  uint uVar7;
  long lVar8;
  ulong uVar9;
  ulong uVar10;
  long lVar11;
  long lVar12;
  long lVar13;
  long lVar14;
  long lVar15;
  long lVar16;
  uint uVar17;
  uint uVar18;
  long lVar19;
  int r;
  ulong uVar20;
  long lVar21;
  ulong uVar22;
  uint local_b8;
  Size local_98;
  Mat local_90 [96];
  
  pMVar3 = (this->super_Labeling2D<(Connectivity2D)8,_false>).img_;
  lVar12 = (long)*(int *)&pMVar3->field_0x8;
  lVar19 = (long)*(int *)&pMVar3->field_0xc;
  local_98.height = (int)**(undefined8 **)&pMVar3->field_0x40;
  local_98.width = (int)((ulong)**(undefined8 **)&pMVar3->field_0x40 >> 0x20);
  cv::Mat_<int>::Mat_((Mat_<int> *)local_90,&local_98);
  cv::Mat::operator=(&((this->super_Labeling2D<(Connectivity2D)8,_false>).img_labels_)->super_Mat,
                     local_90);
  cv::Mat::~Mat(local_90);
  uVar1 = *(undefined8 *)&((this->super_Labeling2D<(Connectivity2D)8,_false>).img_)->field_0x8;
  TTA::Alloc((((int)((ulong)uVar1 >> 0x20) + 1) / 2) * (((int)uVar1 + 1) / 2) + 1);
  *TTA::rtable_ = 0;
  TTA::length_ = 1;
  for (uVar20 = 0; (long)uVar20 < lVar12; uVar20 = uVar20 + 2) {
    pMVar3 = (this->super_Labeling2D<(Connectivity2D)8,_false>).img_;
    pMVar4 = (this->super_Labeling2D<(Connectivity2D)8,_false>).img_labels_;
    lVar14 = **(long **)&pMVar3->field_0x48;
    lVar16 = lVar14 * uVar20 + *(long *)&pMVar3->field_0x10;
    lVar15 = lVar16 - lVar14;
    lVar8 = lVar15 - lVar14;
    lVar13 = **(long **)&pMVar4->field_0x48;
    lVar21 = lVar13 * uVar20 + *(long *)&pMVar4->field_0x10;
    lVar14 = lVar14 + lVar16;
    lVar13 = lVar21 + lVar13 * -2;
    uVar9 = uVar20 | 1;
    for (uVar22 = 0; (long)uVar22 < lVar19; uVar22 = uVar22 + 2) {
      lVar11 = lVar13;
      if (*(char *)(lVar16 + uVar22) == '\0') {
        if (((long)uVar9 < lVar12) && (*(char *)(lVar14 + uVar22) != '\0')) {
          uVar10 = uVar22 | 1;
          if ((lVar19 <= (long)uVar10) || (*(char *)(lVar16 + uVar10) == '\0')) {
            if ((uVar22 != 0) &&
               ((*(char *)((uVar22 - 1) + lVar14) != '\0' ||
                (*(char *)(lVar16 + -1 + uVar22) != '\0')))) goto LAB_0018b3e6;
            goto LAB_0018b33c;
          }
          if (uVar22 == 0) {
LAB_0018aff9:
            if (uVar20 == 0) goto LAB_0018b33c;
            if (*(char *)(lVar15 + (uVar22 | 1)) == '\0') {
              if (((long)(uVar22 + 2) < lVar19) && (*(char *)(lVar15 + uVar22 + 2) != '\0')) {
                if (*(char *)(lVar15 + uVar22) == '\0') goto LAB_0018b3b6;
                goto LAB_0018b1d1;
              }
              if (*(char *)(lVar15 + uVar22) == '\0') goto LAB_0018b33c;
            }
            goto LAB_0018b333;
          }
          if (*(char *)((uVar22 - 1) + lVar16) == '\0') {
            if (*(char *)(lVar14 + -1 + uVar22) == '\0') goto LAB_0018aff9;
            if (uVar20 != 0) {
              if (*(char *)(lVar15 + uVar10) != '\0') {
                if (*(char *)((uVar22 - 2) + lVar16) == '\0') goto LAB_0018b3ff;
                if (*(char *)(lVar15 + -1 + uVar22) == '\0') {
                  cVar2 = *(char *)(lVar15 + -2 + uVar22);
                  goto joined_r0x0018b515;
                }
                if (*(char *)(lVar15 + uVar22) != '\0') goto LAB_0018b3e6;
                goto LAB_0018b130;
              }
              if (((long)(uVar22 + 2) < lVar19) && (*(char *)(lVar15 + uVar22 + 2) != '\0')) {
                if (*(char *)(lVar8 + uVar10) == '\0') {
                  if (*(char *)(lVar15 + uVar22) != '\0') {
                    if (*(char *)((uVar22 - 2) + lVar16) == '\0') goto LAB_0018b594;
                    if (*(char *)(lVar15 + -1 + uVar22) == '\0') goto LAB_0018b552;
                  }
                }
                else if (*(char *)((uVar22 - 2) + lVar16) != '\0') {
                  if (*(char *)(lVar15 + -1 + uVar22) == '\0') {
                    cVar2 = *(char *)(lVar15 + -2 + uVar22);
                    goto joined_r0x0018b483;
                  }
                  goto LAB_0018b4f2;
                }
                goto LAB_0018b57b;
              }
              if (*(char *)(lVar15 + uVar22) != '\0') {
                if (*(char *)((uVar22 - 2) + lVar16) == '\0') goto LAB_0018b3ff;
                if (*(char *)(lVar15 + -1 + uVar22) == '\0') goto LAB_0018b3d1;
              }
            }
          }
          else if (uVar20 != 0) {
            if (*(char *)(lVar15 + uVar10) == '\0') goto LAB_0018b050;
            goto LAB_0018af4d;
          }
LAB_0018b3e6:
          uVar7 = *(uint *)(lVar21 + -8 + uVar22 * 4);
          goto LAB_0018b3eb;
        }
        uVar10 = uVar22 | 1;
        if ((long)uVar10 < lVar19) {
          if (*(char *)(lVar16 + uVar10) != '\0') goto LAB_0018aff9;
          if (((long)uVar9 < lVar12) && (*(char *)(lVar14 + uVar10) != '\0')) goto LAB_0018b33c;
        }
        *(undefined4 *)(lVar21 + uVar22 * 4) = 0;
      }
      else {
        if (uVar22 == 0) {
LAB_0018b140:
          uVar10 = uVar22 | 1;
          if ((uVar20 == 0) || ((lVar19 <= (long)uVar10 || (*(char *)(lVar15 + uVar10) == '\0')))) {
            if (((long)uVar10 < lVar19) && (*(char *)(lVar16 + uVar10) != '\0')) {
              if ((uVar20 == 0) || (lVar19 <= (long)(uVar22 + 2))) {
                if (uVar20 == 0) goto LAB_0018b33c;
              }
              else if (*(char *)(lVar15 + uVar22 + 2) != '\0') {
                if (*(char *)(lVar15 + uVar22) == '\0') {
                  if (((uVar22 == 0) || (*(char *)(lVar15 + -1 + uVar22) == '\0')) ||
                     ((*(char *)(lVar8 + uVar10) != '\0' && (*(char *)(lVar8 + uVar22) != '\0'))))
                  goto LAB_0018b3b6;
                  uVar7 = *(uint *)(lVar13 + -8 + uVar22 * 4);
                }
                else {
LAB_0018b1d1:
                  if (*(char *)(lVar8 + (uVar22 | 1)) != '\0') {
LAB_0018b3b6:
                    uVar7 = *(uint *)(lVar13 + 8 + uVar22 * 4);
                    goto LAB_0018b3eb;
                  }
                  uVar7 = *(uint *)(lVar13 + uVar22 * 4);
                }
                uVar17 = *(uint *)(lVar13 + 8 + uVar22 * 4);
                goto LAB_0018b58a;
              }
              if (*(char *)(lVar15 + uVar22) != '\0') {
LAB_0018b333:
                uVar7 = *(uint *)(lVar11 + uVar22 * 4);
                goto LAB_0018b3eb;
              }
              if (uVar20 != 0 && uVar22 != 0) {
LAB_0018b284:
                lVar11 = lVar13 + -8;
                if (*(char *)(lVar15 + -1 + uVar22) != '\0') goto LAB_0018b333;
              }
            }
            else if (uVar20 != 0) {
              if (*(char *)(lVar15 + uVar22) != '\0') goto LAB_0018b333;
              if (uVar22 != 0) goto LAB_0018b284;
            }
LAB_0018b33c:
            uVar7 = TTA::NewLabel();
            goto LAB_0018b3eb;
          }
          if ((((*(char *)(lVar15 + uVar22) != '\0') || (uVar22 == 0)) ||
              (*(char *)(lVar15 + -1 + uVar22) == '\0')) || (*(char *)(lVar8 + uVar22) != '\0'))
          goto LAB_0018b333;
          uVar7 = *(uint *)(lVar13 + -8 + uVar22 * 4);
          uVar17 = *(uint *)(lVar13 + uVar22 * 4);
        }
        else {
          if (*(char *)(lVar16 + -1 + uVar22) != '\0') {
            uVar10 = uVar22 | 1;
            if (((uVar20 == 0) || (lVar19 <= (long)uVar10)) || (*(char *)(lVar15 + uVar10) == '\0'))
            {
              if ((((long)uVar10 < lVar19) && (*(char *)(lVar16 + uVar10) != '\0')) && (uVar20 != 0)
                 ) {
LAB_0018b050:
                if ((((long)(uVar22 + 2) < lVar19) && (*(char *)(lVar15 + uVar22 + 2) != '\0')) &&
                   ((*(char *)(lVar8 + (uVar22 | 1)) == '\0' ||
                    ((*(char *)(lVar15 + uVar22) == '\0' &&
                     ((*(char *)(lVar8 + uVar22) == '\0' ||
                      ((*(char *)(lVar15 + -1 + uVar22) == '\0' &&
                       ((*(char *)((uVar22 - 2) + lVar15) == '\0' ||
                        (*(char *)(lVar8 + -1 + uVar22) == '\0')))))))))))) goto LAB_0018b57b;
              }
            }
            else {
LAB_0018af4d:
              if (*(char *)(lVar15 + uVar22) == '\0') {
                if (*(char *)(lVar8 + uVar22) != '\0') {
                  if (*(char *)(lVar15 + -1 + uVar22) != '\0') goto LAB_0018b3e6;
                  cVar2 = *(char *)((uVar22 - 2) + lVar15);
joined_r0x0018af7a:
                  if (cVar2 != '\0') {
                    cVar2 = *(char *)(lVar8 + -1 + uVar22);
                    goto joined_r0x0018b3e4;
                  }
                }
LAB_0018b3ff:
                uVar7 = *(uint *)(lVar13 + uVar22 * 4);
                goto LAB_0018b585;
              }
            }
            goto LAB_0018b3e6;
          }
          if ((lVar12 <= (long)uVar9) || (*(char *)(lVar14 + -1 + uVar22) == '\0'))
          goto LAB_0018b140;
          uVar10 = uVar22 | 1;
          if (((uVar20 == 0) || (lVar19 <= (long)uVar10)) || (*(char *)(lVar15 + uVar10) == '\0')) {
            if (((lVar19 <= (long)uVar10) || (*(char *)(lVar16 + uVar10) == '\0')) ||
               ((uVar20 == 0 ||
                ((lVar19 <= (long)(uVar22 + 2) || (*(char *)(lVar15 + uVar22 + 2) == '\0')))))) {
              if (uVar20 != 0) {
                if (*(char *)(lVar15 + -1 + uVar22) == '\0') {
                  if (*(char *)(lVar15 + uVar22) != '\0') {
                    if (*(char *)((uVar22 - 2) + lVar16) != '\0') {
LAB_0018b3d1:
                      cVar2 = *(char *)(lVar15 + -2 + uVar22);
                      goto joined_r0x0018af7a;
                    }
                    goto LAB_0018b3ff;
                  }
                }
                else if (*(char *)((uVar22 - 2) + lVar16) == '\0') {
                  uVar7 = *(uint *)(lVar13 + -8 + uVar22 * 4);
                  goto LAB_0018b585;
                }
              }
              goto LAB_0018b3e6;
            }
            if (*(char *)((uVar22 - 2) + lVar16) == '\0') {
              if (*(char *)(lVar15 + uVar22) == '\0') {
                if ((*(char *)(lVar15 + -1 + uVar22) != '\0') &&
                   ((*(char *)(lVar8 + uVar10) == '\0' || (*(char *)(lVar8 + uVar22) == '\0')))) {
                  uVar7 = *(uint *)(lVar13 + -8 + uVar22 * 4);
                  goto LAB_0018b59d;
                }
              }
              else {
                cVar2 = *(char *)(lVar8 + uVar10);
joined_r0x0018b49e:
                if (cVar2 == '\0') {
LAB_0018b594:
                  uVar7 = *(uint *)(lVar13 + uVar22 * 4);
LAB_0018b59d:
                  uVar17 = *(uint *)(lVar13 + 8 + uVar22 * 4);
                  goto LAB_0018b5a2;
                }
              }
            }
            else if (*(char *)(lVar15 + -1 + uVar22) == '\0') {
              if (*(char *)(lVar8 + uVar10) == '\0') {
                if (*(char *)(lVar15 + uVar22) != '\0') {
LAB_0018b552:
                  if (*(char *)(lVar15 + -2 + uVar22) != '\0') {
                    cVar2 = *(char *)(lVar8 + -1 + uVar22);
                    goto joined_r0x0018b49e;
                  }
                  goto LAB_0018b594;
                }
              }
              else {
                cVar2 = *(char *)(lVar15 + -2 + uVar22);
joined_r0x0018b483:
                if ((cVar2 != '\0') && (*(char *)(lVar8 + -1 + uVar22) != '\0')) {
LAB_0018b4f2:
                  cVar2 = *(char *)(lVar15 + uVar22);
                  goto joined_r0x0018b4f7;
                }
              }
            }
            else if (*(char *)(lVar8 + uVar10) != '\0') {
              cVar2 = *(char *)(lVar15 + uVar22);
joined_r0x0018b4f7:
              if ((cVar2 != '\0') || (*(char *)(lVar8 + uVar22) != '\0')) goto LAB_0018b3e6;
            }
LAB_0018b57b:
            uVar7 = *(uint *)(lVar13 + 8 + uVar22 * 4);
LAB_0018b585:
            uVar17 = *(uint *)(lVar21 + -8 + uVar22 * 4);
          }
          else {
            if (*(char *)((uVar22 - 2) + lVar16) != '\0') {
              if (*(char *)(lVar15 + -1 + uVar22) == '\0') {
                cVar2 = *(char *)(lVar15 + -2 + uVar22);
joined_r0x0018b515:
                if ((cVar2 == '\0') || (*(char *)(lVar8 + -1 + uVar22) == '\0')) goto LAB_0018b3ff;
              }
              if (*(char *)(lVar15 + uVar22) == '\0') {
LAB_0018b130:
                cVar2 = *(char *)(lVar8 + uVar22);
joined_r0x0018b3e4:
                if (cVar2 == '\0') goto LAB_0018b3ff;
              }
              goto LAB_0018b3e6;
            }
            if (((*(char *)(lVar15 + uVar22) != '\0') || (*(char *)(lVar15 + -1 + uVar22) == '\0'))
               || (*(char *)(lVar8 + uVar22) != '\0')) goto LAB_0018b3ff;
            uVar7 = *(uint *)(lVar13 + -8 + uVar22 * 4);
            uVar17 = *(uint *)(lVar13 + uVar22 * 4);
LAB_0018b5a2:
            uVar7 = TTA::Merge(uVar7,uVar17);
            uVar17 = *(uint *)(lVar21 + -8 + uVar22 * 4);
          }
        }
LAB_0018b58a:
        uVar7 = TTA::Merge(uVar7,uVar17);
LAB_0018b3eb:
        *(uint *)(lVar21 + uVar22 * 4) = uVar7;
      }
    }
  }
  uVar7 = TTA::Flatten();
  (this->super_Labeling2D<(Connectivity2D)8,_false>).n_labels_ = uVar7;
  puVar5 = TTA::rtable_;
  pMVar3 = (this->super_Labeling2D<(Connectivity2D)8,_false>).img_;
  pMVar4 = (this->super_Labeling2D<(Connectivity2D)8,_false>).img_labels_;
  uVar7 = *(uint *)&pMVar4->field_0x8;
  local_b8 = *(uint *)&pMVar4->field_0xc & 0x80000001;
  uVar20 = (long)(int)*(uint *)&pMVar4->field_0xc & 0xfffffffffffffffe;
  lVar12 = 1;
  lVar19 = 0;
  do {
    puVar6 = TTA::rtable_;
    if ((long)((long)(int)uVar7 & 0xfffffffffffffffeU) <= lVar19) {
      if ((uVar7 & 0x80000001) == 1) {
        lVar14 = **(long **)&pMVar3->field_0x48 * lVar19 + *(long *)&pMVar3->field_0x10;
        lVar12 = lVar19 * **(long **)&pMVar4->field_0x48 + *(long *)&pMVar4->field_0x10;
        for (lVar19 = 0; lVar19 < (long)uVar20; lVar19 = lVar19 + 2) {
          lVar13 = (long)*(int *)(lVar12 + lVar19 * 4);
          if (lVar13 < 1) {
            *(undefined8 *)(lVar12 + lVar19 * 4) = 0;
          }
          else {
            uVar7 = puVar6[lVar13];
            uVar17 = uVar7;
            if (*(char *)(lVar14 + lVar19) == '\0') {
              uVar17 = 0;
            }
            *(uint *)(lVar12 + lVar19 * 4) = uVar17;
            if (*(char *)(lVar14 + 1 + lVar19) == '\0') {
              *(undefined4 *)(lVar12 + 4 + lVar19 * 4) = 0;
            }
            else {
              *(uint *)(lVar12 + 4 + lVar19 * 4) = uVar7;
            }
          }
        }
        if (local_b8 == 1) {
          lVar13 = (long)*(int *)(lVar12 + lVar19 * 4);
          uVar7 = 0;
          if ((0 < lVar13) && (uVar7 = 0, *(char *)(lVar19 + lVar14) != '\0')) {
            uVar7 = TTA::rtable_[lVar13];
          }
          *(uint *)(lVar12 + lVar19 * 4) = uVar7;
        }
      }
      TTA::Dealloc();
      return;
    }
    lVar14 = **(long **)&pMVar4->field_0x48;
    lVar16 = lVar14 * lVar19 + *(long *)&pMVar4->field_0x10;
    lVar15 = lVar14 * lVar12 + *(long *)&pMVar4->field_0x10;
    lVar8 = **(long **)&pMVar3->field_0x48 * lVar12 + *(long *)&pMVar3->field_0x10;
    lVar13 = **(long **)&pMVar3->field_0x48 * lVar19 + *(long *)&pMVar3->field_0x10;
    for (uVar9 = 0; (long)uVar9 < (long)uVar20; uVar9 = uVar9 + 2) {
      lVar21 = (long)*(int *)(lVar16 + uVar9 * 4);
      if (lVar21 < 1) {
        *(undefined8 *)(lVar16 + uVar9 * 4) = 0;
        uVar22 = uVar9 | 1;
        *(undefined4 *)(lVar15 + uVar9 * 4) = 0;
        uVar17 = 0;
      }
      else {
        uVar17 = puVar6[lVar21];
        uVar18 = uVar17;
        if (*(char *)(lVar13 + uVar9) == '\0') {
          uVar18 = 0;
        }
        *(uint *)(lVar16 + uVar9 * 4) = uVar18;
        uVar18 = uVar17;
        if (*(char *)(lVar13 + 1 + uVar9) == '\0') {
          uVar18 = 0;
        }
        uVar22 = uVar9 + 1;
        *(uint *)(lVar16 + 4 + uVar9 * 4) = uVar18;
        uVar18 = uVar17;
        if (*(char *)(lVar8 + uVar9) == '\0') {
          uVar18 = 0;
        }
        *(uint *)(lVar15 + uVar9 * 4) = uVar18;
        if (*(char *)(lVar8 + 1 + uVar9) == '\0') {
          uVar17 = 0;
        }
      }
      *(uint *)(lVar16 + lVar14 + uVar22 * 4) = uVar17;
    }
    if (local_b8 == 1) {
      lVar14 = (long)*(int *)(lVar16 + uVar9 * 4);
      if (lVar14 < 1) {
        *(undefined4 *)(lVar16 + uVar9 * 4) = 0;
      }
      else {
        uVar17 = puVar5[lVar14];
        uVar18 = uVar17;
        if (*(char *)(uVar9 + lVar13) == '\0') {
          uVar18 = 0;
        }
        *(uint *)(lVar16 + uVar9 * 4) = uVar18;
        if (*(char *)(uVar9 + lVar8) != '\0') {
          *(uint *)(lVar15 + uVar9 * 4) = uVar17;
          goto LAB_0018b718;
        }
      }
      *(undefined4 *)(lVar15 + uVar9 * 4) = 0;
    }
LAB_0018b718:
    lVar19 = lVar19 + 2;
    lVar12 = lVar12 + 2;
  } while( true );
}

Assistant:

void PerformLabeling()
    {
        const int h = img_.rows;
        const int w = img_.cols;

        img_labels_ = cv::Mat1i(img_.size()); // Memory allocation for the output image

        LabelsSolver::Alloc(UPPER_BOUND_8_CONNECTIVITY); // Memory allocation of the labels solver
        LabelsSolver::Setup(); // Labels solver initialization

        // We work with 2x2 blocks
        // +-+-+-+
        // |P|Q|R|
        // +-+-+-+
        // |S|X|
        // +-+-+

        // The pixels are named as follows
        // +---+---+---+
        // |a b|c d|e f|
        // |g h|i j|k l|
        // +---+---+---+
        // |m n|o p|
        // |q r|s t|
        // +---+---+

        // Pixels a, f, l, q are not needed, since we need to understand the
        // the connectivity between these blocks and those pixels only matter
        // when considering the outer connectivities

        // A bunch of defines used to check if the pixels are foreground,
        // without going outside the image limits.

        // First scan
        for (int r = 0; r < h; r += 2) {
            // Get rows pointer
            const unsigned char* const img_row = img_.ptr<unsigned char>(r);
            const unsigned char* const img_row_prev = (unsigned char *)(((char *)img_row) - img_.step.p[0]);
            const unsigned char* const img_row_prev_prev = (unsigned char *)(((char *)img_row_prev) - img_.step.p[0]);
            const unsigned char* const img_row_fol = (unsigned char *)(((char *)img_row) + img_.step.p[0]);
            unsigned* const img_labels_row = img_labels_.ptr<unsigned>(r);
            unsigned* const img_labels_row_prev_prev = (unsigned *)(((char *)img_labels_row) - img_labels_.step.p[0] - img_labels_.step.p[0]);

            for (int c = 0; c < w; c += 2) {

#define CONDITION_B c-1>=0 && r-2>=0 && img_row_prev_prev[c-1]>0
#define CONDITION_C r-2>=0 && img_row_prev_prev[c]>0
#define CONDITION_D c+1<w && r-2>=0 && img_row_prev_prev[c+1]>0
#define CONDITION_E c+2<w && r-2>=0 && img_row_prev_prev[c+2]>0

#define CONDITION_G c-2>=0 && r-1>=0 && img_row_prev[c-2]>0
#define CONDITION_H c-1>=0 && r-1>=0 && img_row_prev[c-1]>0
#define CONDITION_I r-1>=0 && img_row_prev[c]>0
#define CONDITION_J c+1<w && r-1>=0 && img_row_prev[c+1]>0
#define CONDITION_K c+2<w && r-1>=0 && img_row_prev[c+2]>0

#define CONDITION_M c-2>=0 && img_row[c-2]>0
#define CONDITION_N c-1>=0 && img_row[c-1]>0
#define CONDITION_O img_row[c]>0
#define CONDITION_P c+1<w && img_row[c+1]>0

#define CONDITION_R c-1>=0 && r+1<h && img_row_fol[c-1]>0
#define CONDITION_S r+1<h && img_row_fol[c]>0
#define CONDITION_T c+1<w && r+1<h && img_row_fol[c+1]>0

                // Action 1: No action
#define ACTION_1 img_labels_row[c] = 0; continue; 
                // Action 2: New label (the block has foreground pixels and is not connected to anything else)
#define ACTION_2 img_labels_row[c] = LabelsSolver::NewLabel(); continue; 
                //Action 3: Assign label of block P
#define ACTION_3 img_labels_row[c] = img_labels_row_prev_prev[c - 2]; continue;
                // Action 4: Assign label of block Q 
#define ACTION_4 img_labels_row[c] = img_labels_row_prev_prev[c]; continue;
                // Action 5: Assign label of block R
#define ACTION_5 img_labels_row[c] = img_labels_row_prev_prev[c + 2]; continue;
                // Action 6: Assign label of block S
#define ACTION_6 img_labels_row[c] = img_labels_row[c - 2]; continue; 
                // Action 7: Merge labels of block P and Q
#define ACTION_7 img_labels_row[c] = LabelsSolver::Merge(img_labels_row_prev_prev[c - 2], img_labels_row_prev_prev[c]); continue;
                //Action 8: Merge labels of block P and R
#define ACTION_8 img_labels_row[c] = LabelsSolver::Merge(img_labels_row_prev_prev[c - 2], img_labels_row_prev_prev[c + 2]); continue;
                // Action 9 Merge labels of block P and S
#define ACTION_9 img_labels_row[c] = LabelsSolver::Merge(img_labels_row_prev_prev[c - 2], img_labels_row[c - 2]); continue;
                // Action 10 Merge labels of block Q and R
#define ACTION_10 img_labels_row[c] = LabelsSolver::Merge(img_labels_row_prev_prev[c], img_labels_row_prev_prev[c + 2]); continue;
                // Action 11: Merge labels of block Q and S
#define ACTION_11 img_labels_row[c] = LabelsSolver::Merge(img_labels_row_prev_prev[c], img_labels_row[c - 2]); continue;
                // Action 12: Merge labels of block R and S
#define ACTION_12 img_labels_row[c] = LabelsSolver::Merge(img_labels_row_prev_prev[c + 2], img_labels_row[c - 2]); continue;
                // Action 13: not used
#define ACTION_13 
                // Action 14: Merge labels of block P, Q and S
#define ACTION_14 img_labels_row[c] = LabelsSolver::Merge(LabelsSolver::Merge(img_labels_row_prev_prev[c - 2], img_labels_row_prev_prev[c]), img_labels_row[c - 2]); continue;
                //Action 15: Merge labels of block P, R and S
#define ACTION_15 img_labels_row[c] = LabelsSolver::Merge(LabelsSolver::Merge(img_labels_row_prev_prev[c - 2], img_labels_row_prev_prev[c + 2]), img_labels_row[c - 2]); continue;
                //Action 16: labels of block Q, R and S
#define ACTION_16 img_labels_row[c] = LabelsSolver::Merge(LabelsSolver::Merge(img_labels_row_prev_prev[c], img_labels_row_prev_prev[c + 2]), img_labels_row[c - 2]); continue;

#include "labeling_grana_2010_tree.inc.h"
            }
        }

        // Second scan
        n_labels_ = LabelsSolver::Flatten();

        int e_rows = img_labels_.rows & 0xfffffffe;
        bool o_rows = img_labels_.rows % 2 == 1;
        int e_cols = img_labels_.cols & 0xfffffffe;
        bool o_cols = img_labels_.cols % 2 == 1;

        int r = 0;
        for (; r < e_rows; r += 2) {
            // Get rows pointer
            const unsigned char* const img_row = img_.ptr<unsigned char>(r);
            const unsigned char* const img_row_fol = (unsigned char *)(((char *)img_row) + img_.step.p[0]);

            unsigned* const img_labels_row = img_labels_.ptr<unsigned>(r);
            unsigned* const img_labels_row_fol = (unsigned *)(((char *)img_labels_row) + img_labels_.step.p[0]);
            int c = 0;
            for (; c < e_cols; c += 2) {
                int iLabel = img_labels_row[c];
                if (iLabel > 0) {
                    iLabel = LabelsSolver::GetLabel(iLabel);
                    if (img_row[c] > 0)
                        img_labels_row[c] = iLabel;
                    else
                        img_labels_row[c] = 0;
                    if (img_row[c + 1] > 0)
                        img_labels_row[c + 1] = iLabel;
                    else
                        img_labels_row[c + 1] = 0;
                    if (img_row_fol[c] > 0)
                        img_labels_row_fol[c] = iLabel;
                    else
                        img_labels_row_fol[c] = 0;
                    if (img_row_fol[c + 1] > 0)
                        img_labels_row_fol[c + 1] = iLabel;
                    else
                        img_labels_row_fol[c + 1] = 0;
                }
                else {
                    img_labels_row[c] = 0;
                    img_labels_row[c + 1] = 0;
                    img_labels_row_fol[c] = 0;
                    img_labels_row_fol[c + 1] = 0;
                }
            }
            // Last column if the number of columns is odd
            if (o_cols) {
                int iLabel = img_labels_row[c];
                if (iLabel > 0) {
                    iLabel = LabelsSolver::GetLabel(iLabel);
                    if (img_row[c] > 0)
                        img_labels_row[c] = iLabel;
                    else
                        img_labels_row[c] = 0;
                    if (img_row_fol[c] > 0)
                        img_labels_row_fol[c] = iLabel;
                    else
                        img_labels_row_fol[c] = 0;
                }
                else {
                    img_labels_row[c] = 0;
                    img_labels_row_fol[c] = 0;
                }
            }
        }
        // Last row if the number of rows is odd
        if (o_rows) {
            // Get rows pointer
            const unsigned char* const img_row = img_.ptr<unsigned char>(r);
            unsigned* const img_labels_row = img_labels_.ptr<unsigned>(r);
            int c = 0;
            for (; c < e_cols; c += 2) {
                int iLabel = img_labels_row[c];
                if (iLabel > 0) {
                    iLabel = LabelsSolver::GetLabel(iLabel);
                    if (img_row[c] > 0)
                        img_labels_row[c] = iLabel;
                    else
                        img_labels_row[c] = 0;
                    if (img_row[c + 1] > 0)
                        img_labels_row[c + 1] = iLabel;
                    else
                        img_labels_row[c + 1] = 0;
                }
                else {
                    img_labels_row[c] = 0;
                    img_labels_row[c + 1] = 0;
                }
            }
            // Last column if the number of columns is odd
            if (o_cols) {
                int iLabel = img_labels_row[c];
                if (iLabel > 0) {
                    iLabel = LabelsSolver::GetLabel(iLabel);
                    if (img_row[c] > 0)
                        img_labels_row[c] = iLabel;
                    else
                        img_labels_row[c] = 0;
                }
                else {
                    img_labels_row[c] = 0;
                }
            }
        }

        LabelsSolver::Dealloc();

#undef ACTION_1
#undef ACTION_2
#undef ACTION_3
#undef ACTION_4
#undef ACTION_5
#undef ACTION_6
#undef ACTION_7
#undef ACTION_8
#undef ACTION_9
#undef ACTION_10
#undef ACTION_11
#undef ACTION_12
#undef ACTION_13
#undef ACTION_14
#undef ACTION_15
#undef ACTION_16


#undef CONDITION_B
#undef CONDITION_C
#undef CONDITION_D
#undef CONDITION_E

#undef CONDITION_G
#undef CONDITION_H
#undef CONDITION_I
#undef CONDITION_J
#undef CONDITION_K

#undef CONDITION_M
#undef CONDITION_N
#undef CONDITION_O
#undef CONDITION_P

#undef CONDITION_R
#undef CONDITION_S
#undef CONDITION_T
    }